

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockBuilder::FilterBlockBuilder(FilterBlockBuilder *this,FilterPolicy *policy)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x146fc5);
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::vector
            ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)0x146fdf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x146fec);
  return;
}

Assistant:

FilterBlockBuilder::FilterBlockBuilder(const FilterPolicy* policy)
    : policy_(policy) {}